

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemListView.cpp
# Opt level: O0

void __thiscall
QFileSystemListViewPrivate::~QFileSystemListViewPrivate(QFileSystemListViewPrivate *this)

{
  void *in_RDI;
  
  ~QFileSystemListViewPrivate((QFileSystemListViewPrivate *)0x2350e8);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

class QFileSystemListViewPrivate : public QObject {
    Q_OBJECT

public:
    explicit QFileSystemListViewPrivate(QFileSystemListView *widgetP)
        : QObject(widgetP)
        , widget(widgetP)
        , model(new QFileSystemModel(this))
        , browsable(!(model->filter() & QDir::NoDotDot)) {
        Q_ASSERT(widget);

        connect(model, &QFileSystemModel::directoryLoaded, widget, &QFileSystemListView::directoryLoaded);
        connect(model, &QFileSystemModel::fileRenamed, widget, &QFileSystemListView::fileRenamed);
        connect(model, &QFileSystemModel::rootPathChanged, widget, &QFileSystemListView::rootPathChanged);
        connect(widget, &QFileSystemListView::activated, this, &QFileSystemListViewPrivate::activated);
    }

    void updateItemSelection(const QStringList &selection, QItemSelectionModel::SelectionFlags flags,
                             int column = 0) const {
        // QMap give us sorting for free
        QMap<QModelIndex, QMap<QModelIndex, int>> mapIndexes;
        QItemSelection itemSelection;

        foreach (const QString &item, selection) {
            const QModelIndex index = model->index(item, column);

            if (index.isValid()) {
                mapIndexes[index.parent()][index]++;
            }
        }

        foreach (const QModelIndex &parent, mapIndexes.keys()) {
            const QModelIndexList indexes = mapIndexes[parent].keys();
            int top = -1;
            int bottom = -1;

            for (int i = 0; i < indexes.count(); i++) {
                const QModelIndex &index = indexes[i];
                const bool hasNext = i + 1 < indexes.count();

                if (top == -1) {
                    top = index.row();
                } else {
                    if (bottom == -1) {
                        // index is not contiguous
                        if (index.row() != top + 1) {
                            const QModelIndex idx = model->index(top, column, parent);
                            itemSelection << QItemSelectionRange(idx, idx);

                            top = index.row();
                            bottom = -1;
                        } else {
                            bottom = index.row();
                        }
                    } else if (index.row() != bottom + 1) {
                        // index is not contiguous
                        if (index.row() != top + 1) {
                            const QModelIndex idx1 = model->index(top, column, parent);
                            const QModelIndex idx2 = model->index(bottom, column, parent);
                            itemSelection << QItemSelectionRange(idx1, idx2);

                            top = index.row();
                            bottom = -1;
                        } else {
                            bottom = index.row();
                        }
                    }
                }

                if (!hasNext && top != -1) {
                    if (bottom == -1) {
                        bottom = top;
                    }

                    const QModelIndex idx1 = model->index(top, column, parent);
                    const QModelIndex idx2 = model->index(bottom, column, parent);
                    itemSelection << QItemSelection(idx1, idx2);

                    top = -1;
                    bottom = -1;
                }
            }
        }

        widget->selectionModel()->select(itemSelection, flags);
    }